

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *gtgt)

{
  cmMakefile *this_00;
  string *psVar1;
  cmValue cVar2;
  string language;
  string COMPILE_OPTIONS;
  string COMPILE_FLAGS;
  cmGeneratorExpressionInterpreter genexInterpreter;
  allocator<char> local_191;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  cmGeneratorExpressionInterpreter local_98;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(source);
  std::__cxx11::string::string((string *)&local_190,(string *)psVar1);
  if (local_190._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_190);
  }
  cmGeneratorTarget::AddExplicitLanguageFlags(gtgt,__return_storage_ptr__,source);
  this_00 = lg->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_150);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  cmLocalGenerator::GetTargetCompileFlags
            (&local_b0,lg,gtgt,psVar1,&local_190,__return_storage_ptr__);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_b0);
  std::__cxx11::string::string((string *)&local_d0,(string *)psVar1);
  std::__cxx11::string::string((string *)&local_f0,(string *)&local_190);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_98,lg,&local_d0,gtgt,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"COMPILE_FLAGS",(allocator<char> *)&local_170);
  cVar2 = cmSourceFile::GetProperty(source,&local_150);
  if (cVar2.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_110,(string *)cVar2.Value);
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(&local_98,&local_110,&local_150);
    (*(lg->super_cmOutputConverter)._vptr_cmOutputConverter[7])(lg,__return_storage_ptr__,psVar1);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"COMPILE_OPTIONS",&local_191);
  cVar2 = cmSourceFile::GetProperty(source,&local_170);
  if (cVar2.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_130,(string *)cVar2.Value);
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(&local_98,&local_130,&local_170);
    cmLocalGenerator::AppendCompileOptions(lg,__return_storage_ptr__,psVar1,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&local_98);
  std::__cxx11::string::~string((string *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeFlagsForObject(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* gtgt)
{
  std::string flags;
  std::string language = source->GetOrDetermineLanguage();
  if (language.empty()) {
    language = "C";
  }

  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  gtgt->AddExplicitLanguageFlags(flags, *source);

  std::string const& config =
    lg->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  lg->GetTargetCompileFlags(gtgt, config, language, flags);

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, gtgt,
                                                    language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    lg->AppendFlags(flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    lg->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  return flags;
}